

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeView::indexRowSizeHint(QTreeView *this,QModelIndex *index)

{
  int iVar1;
  long lVar2;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Representation RVar8;
  QEditorInfo *pQVar9;
  int extraout_var;
  QSize QVar10;
  QSize QVar11;
  long *plVar12;
  int extraout_var_00;
  int iVar13;
  int column;
  long in_FS_OFFSET;
  int local_16c;
  QWidget *editor;
  QModelIndex local_148;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem option;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar4 = QAbstractItemViewPrivate::isIndexValid(this_00,index);
  local_16c = 0;
  if ((bVar4) &&
     (bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_00->itemDelegate), local_16c = 0,
     bVar4)) {
    iVar1 = index->r;
    iVar5 = QHeaderView::count(*(QHeaderView **)
                                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x50);
    local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent((QModelIndex *)&local_128,index);
    if ((iVar5 == 0) ||
       ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)
         ->widget_attributes & 0x8000) == 0)) {
      iVar6 = (**(code **)(*(long *)this_00->model + 0x80))(this_00->model,&local_128);
      iVar7 = -1;
    }
    else {
      iVar7 = QHeaderView::visualIndexAt
                        (*(QHeaderView **)
                          &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                           super_QWidgetPrivate.field_0x50,0);
      iVar6 = iVar5;
    }
    local_16c = -1;
    bVar4 = QWidget::isRightToLeft((QWidget *)this);
    iVar6 = iVar6 + -1;
    iVar13 = iVar7;
    if (iVar7 == -1) {
      iVar7 = 0;
      iVar13 = iVar6;
    }
    if (bVar4) {
      iVar6 = 0;
      iVar7 = iVar13;
    }
    iVar13 = iVar7;
    if (iVar7 < iVar6) {
      iVar13 = iVar6;
    }
    if (iVar7 <= iVar6) {
      iVar6 = iVar7;
    }
    memset(&option,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&option);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&option);
    option.super_QStyleOption.rect.x2.m_i = option.super_QStyleOption.rect.x1.m_i + -2;
    for (; iVar6 <= iVar13; iVar6 = iVar6 + 1) {
      iVar7 = iVar6;
      if (iVar5 != 0) {
        iVar7 = QHeaderView::logicalIndex
                          (*(QHeaderView **)
                            &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x50,iVar6);
      }
      bVar4 = QHeaderView::isSectionHidden
                        (*(QHeaderView **)
                          &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                           super_QWidgetPrivate.field_0x50,iVar7);
      if (!bVar4) {
        local_148.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.r = -0x55555556;
        local_148.c = -0x55555556;
        local_148.i._0_4_ = 0xaaaaaaaa;
        local_148.i._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)this_00->model + 0x60))
                  (&local_148,this_00->model,iVar1,iVar7,&local_128);
        if (((-1 < local_148.r) && (-1 < local_148.c)) &&
           (local_148.m.ptr != (QAbstractItemModel *)0x0)) {
          pQVar9 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_148);
          pDVar3 = (pQVar9->widget).wp.d;
          if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
            editor = (QWidget *)0x0;
          }
          else {
            editor = (QWidget *)(pQVar9->widget).wp.value;
            if ((editor != (QWidget *)0x0) &&
               (bVar4 = QHash<QWidget_*,_QHashDummyValue>::contains
                                  (&(this_00->persistent).q_hash,&editor), bVar4)) {
              (**(code **)(*(long *)editor + 0x70))();
              if (local_16c <= extraout_var) {
                local_16c = extraout_var;
              }
              QVar10 = QWidget::minimumSize(editor);
              QVar11 = QWidget::maximumSize(editor);
              RVar8.m_i = QVar11.ht.m_i.m_i;
              if (local_16c <= QVar11.ht.m_i.m_i) {
                RVar8.m_i = local_16c;
              }
              local_16c = RVar8.m_i;
              if (RVar8.m_i <= QVar10.ht.m_i.m_i) {
                local_16c = QVar10.ht.m_i.m_i;
              }
            }
          }
          plVar12 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                                   super_QAbstractScrollArea.super_QFrame.
                                                   super_QWidget + 0x208))(this,&local_148);
          (**(code **)(*plVar12 + 0x68))(plVar12,&option,&local_148);
          if (local_16c <= extraout_var_00) {
            local_16c = extraout_var_00;
          }
        }
      }
    }
    QStyleOptionViewItem::~QStyleOptionViewItem(&option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_16c;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeView::indexRowSizeHint(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index) || !d->itemDelegate)
        return 0;

    int start = -1;
    int end = -1;
    int indexRow = index.row();
    int count = d->header->count();
    bool emptyHeader = (count == 0);
    QModelIndex parent = index.parent();

    if (count && isVisible()) {
        // If the sections have moved, we end up checking too many or too few
        start = d->header->visualIndexAt(0);
    } else {
        // If the header has not been laid out yet, we use the model directly
        count = d->model->columnCount(parent);
    }

    if (isRightToLeft()) {
        start = (start == -1 ? count - 1 : start);
        end = 0;
    } else {
        start = (start == -1 ? 0 : start);
        end = count - 1;
    }

    if (end < start)
        qSwap(end, start);

    int height = -1;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
   // ### If we want word wrapping in the items,
    // ### we need to go through all the columns
    // ### and set the width of the column

    // Hack to speed up the function
    option.rect.setWidth(-1);

    for (int column = start; column <= end; ++column) {
        int logicalColumn = emptyHeader ? column : d->header->logicalIndex(column);
        if (d->header->isSectionHidden(logicalColumn))
            continue;
        QModelIndex idx = d->model->index(indexRow, logicalColumn, parent);
        if (idx.isValid()) {
            QWidget *editor = d->editorForIndex(idx).widget.data();
            if (editor && d->persistent.contains(editor)) {
                height = qMax(height, editor->sizeHint().height());
                int min = editor->minimumSize().height();
                int max = editor->maximumSize().height();
                height = qBound(min, height, max);
            }
            int hint = itemDelegateForIndex(idx)->sizeHint(option, idx).height();
            height = qMax(height, hint);
        }
    }

    return height;
}